

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_properties(t_gobj *z,_glist *owner)

{
  t_my_numbox *x;
  _glist *owner_local;
  t_gobj *z_local;
  
  if ((*(uint *)&z[0x44].g_pd >> 0x1b & 1) != 0) {
    *(uint *)&z[0x44].g_pd = *(uint *)&z[0x44].g_pd & 0xf7ffffff;
    sys_queuegui(z,(_glist *)z[3].g_pd,my_numbox_draw_update);
  }
  iemgui_new_dialog(z,(t_iemgui *)z,"nbx",(float)*(int *)((long)&z[0x4e].g_pd + 4),1.0,
                    (float)(*(int *)&z[4].g_pd / *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4)),
                    8.0,(float)(double)z[0x4a].g_next,(float)(double)z[0x4b].g_pd,0,
                    *(int *)&z[0x4c].g_pd,"linear","logarithmic",1,-1,*(int *)&z[0x4e].g_next);
  return;
}

Assistant:

static void my_numbox_properties(t_gobj *z, t_glist *owner)
{
    t_my_numbox *x = (t_my_numbox *)z;

    if(x->x_gui.x_fsf.x_change)
    {
        x->x_gui.x_fsf.x_change = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    }
    iemgui_new_dialog(x, &x->x_gui, "nbx",
                      x->x_numwidth, MINDIGITS,
                      x->x_gui.x_h/IEMGUI_ZOOM(x), IEM_GUI_MINSIZE,
                      x->x_min, x->x_max,
                      0,
                      x->x_lin0_log1, "linear", "logarithmic",
                      1, -1, x->x_log_height);
}